

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::set_allocated_objects
          (VisionFeaturePrint *this,VisionFeaturePrint_Objects *objects)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  VisionFeaturePrint_Objects *objects_local;
  VisionFeaturePrint *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_VisionFeaturePrintType(this);
  if (objects != (VisionFeaturePrint_Objects *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::
         InternalHelper<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects>::
         GetOwningArena(objects);
    message_arena = (Arena *)objects;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects>
                              (message_arena_00,objects,submessage_arena_00);
    }
    set_has_objects(this);
    (this->VisionFeaturePrintType_).scene_ = (VisionFeaturePrint_Scene *)message_arena;
  }
  return;
}

Assistant:

void VisionFeaturePrint::set_allocated_objects(::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects* objects) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_VisionFeaturePrintType();
  if (objects) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects>::GetOwningArena(objects);
    if (message_arena != submessage_arena) {
      objects = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, objects, submessage_arena);
    }
    set_has_objects();
    VisionFeaturePrintType_.objects_ = objects;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.CoreMLModels.VisionFeaturePrint.objects)
}